

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O3

FileName * __thiscall embree::FileName::path(FileName *__return_storage_ptr__,FileName *this)

{
  long lVar1;
  string local_38;
  
  lVar1 = std::__cxx11::string::rfind((char)this,0x2f);
  if (lVar1 == -1) {
    (__return_storage_ptr__->filename)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->filename).field_2;
    (__return_storage_ptr__->filename)._M_string_length = 0;
    (__return_storage_ptr__->filename).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_38,(ulong)this);
    FileName(__return_storage_ptr__,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::path() const {
    size_t pos = filename.find_last_of(path_sep);
    if (pos == std::string::npos) return FileName();
    return filename.substr(0,pos);
  }